

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_hash.h
# Opt level: O0

sc_phash_elem * __thiscall
sc_core::sc_phash_base::find_entry(sc_phash_base *this,uint hv,void *k,sc_phash_elem ***plast)

{
  sc_phash_elem *psVar1;
  sc_phash_elem ***in_RCX;
  void *in_RDX;
  uint in_ESI;
  sc_phash_base *in_RDI;
  sc_phash_base *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  undefined8 in_stack_fffffffffffffff8;
  
  if (in_RDI->cmpr == (cmpr_fn_t)0x0) {
    psVar1 = find_entry_q(in_RDI,in_ESI,in_RDX,in_RCX);
  }
  else {
    psVar1 = find_entry_c(unaff_retaddr,(uint)((ulong)in_stack_fffffffffffffff8 >> 0x20),in_RDI,
                          (sc_phash_elem ***)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
  }
  return psVar1;
}

Assistant:

sc_phash_elem* find_entry(unsigned hv, const void* k, sc_phash_elem*** plast=0) const
    {
      /* Got rid of member func. pointer and replaced with if-else  */
      /* Amit (5/14/99)                                             */
      if( cmpr == 0 )
        return ((sc_phash_base*)this)->find_entry_q( hv, k, plast );
      else
	return ((sc_phash_base*)this)->find_entry_c( hv, k, plast );
    }